

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

Value __thiscall xmrig::OclBackend::toJSON(OclBackend *this,Document *doc)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  long *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  undefined1 auVar3 [16];
  Value VVar4;
  Value thread;
  OclLaunchData *data;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *__range1;
  size_t i;
  Value threads;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_stack_fffffffffffffe78;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe80;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_stack_fffffffffffffe90;
  String *in_stack_fffffffffffffe98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  Document *in_stack_fffffffffffffef0;
  Document *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  local_d8;
  long local_d0;
  long local_c8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_c0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b0;
  GenericStringRef<char> local_a0;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  OclThread *in_stack_ffffffffffffff88;
  GenericStringRef<char> local_68;
  Document *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  GenericStringRef<char> local_38;
  byte local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe80,(Type)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_38,(char (*) [5])0x27c7ac);
  (**(code **)(*in_RSI + 0x28))();
  String::toJSON(in_stack_fffffffffffffe98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffffb8);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_68,(char (*) [8])0x279127);
  (**(code **)(*in_RSI + 0x10))();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
                  (bool)in_stack_fffffffffffffed7,in_stack_fffffffffffffec8);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff88,(char (*) [9])0x279204);
  OclPlatform::toJSON((OclPlatform *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff78);
  bVar1 = std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::empty
                    (in_stack_fffffffffffffe90);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    auVar3 = (**(code **)(*in_RSI + 0x20))();
    uVar2 = auVar3._8_8_;
    this_00 = auVar3._0_8_;
    if (this_00 !=
        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)0x0) {
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_a0,(char (*) [9])"hashrate");
      value = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(**(code **)(*in_RSI + 0x20))();
      Hashrate::toJSON((Hashrate *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                  in_stack_fffffffffffffec8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_b0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffe80,(Type)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      local_c8 = 0;
      local_d0 = in_RSI[1] + 0x58;
      local_d8._M_current =
           (OclLaunchData *)
           std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
                     (in_stack_fffffffffffffe78);
      std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::end
                (in_stack_fffffffffffffe78);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                            *)in_stack_fffffffffffffe80,
                           (__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                            *)in_stack_fffffffffffffe78);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
        ::operator*(&local_d8);
        OclThread::toJSON(in_stack_ffffffffffffff88,(Document *)in_stack_ffffffffffffff80);
        allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)&stack0xfffffffffffffef8;
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>
                  ((GenericStringRef<char> *)allocator_00,(char (*) [9])0x27916f);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
                          CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                          in_stack_fffffffffffffec8);
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>
                  ((GenericStringRef<char> *)&stack0xfffffffffffffee8,(char (*) [9])"hashrate");
        in_stack_fffffffffffffe80 =
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(**(code **)(*in_RSI + 0x20))();
        Hashrate::toJSON((Hashrate *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&stack0xfffffffffffffed8);
        OclDevice::toJSON((OclDevice *)in_stack_ffffffffffffff80,(Value *)in_stack_ffffffffffffff78,
                          (Document *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
        local_c8 = local_c8 + 1;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(this_00,value,allocator_00);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&stack0xffffffffffffff08);
        __gnu_cxx::
        __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
        ::operator++(&local_d8);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>
                ((GenericStringRef<char> *)&stack0xfffffffffffffec8,(char (*) [8])"threads");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffee0,(StringRefType *)in_stack_fffffffffffffed8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                  in_stack_fffffffffffffec8);
      local_21 = 1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_c0);
      uVar2 = extraout_RDX_00;
      goto LAB_0020b438;
    }
  }
  local_21 = 1;
LAB_0020b438:
  if ((local_21 & 1) == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(in_RDI);
    uVar2 = extraout_RDX_01;
  }
  VVar4.data_.s.str = (Ch *)uVar2;
  VVar4.data_.n = (Number)in_RDI;
  return (Value)VVar4.data_;
}

Assistant:

rapidjson::Value xmrig::OclBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);
    out.AddMember("platform",   d_ptr->platform.toJSON(doc), allocator);

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
        Value thread = data.thread.toJSON(doc);
        thread.AddMember("affinity", data.affinity, allocator);
        thread.AddMember("hashrate", hashrate()->toJSON(i, doc), allocator);

        data.device.toJSON(thread, doc);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}